

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O0

void __thiscall Valve::validateStatus(Valve *this,Network *nw,double qTol)

{
  double dVar1;
  ostream *poVar2;
  double dVar3;
  double qTol_local;
  Network *nw_local;
  Valve *this_local;
  
  if ((this->valveType < FCV) && ((this->super_Link).flow < -qTol)) {
    poVar2 = std::operator<<((ostream *)&nw->msgLog,"\nValve ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_Link).super_Element.name);
    poVar2 = std::operator<<(poVar2," flow = ");
    dVar1 = (this->super_Link).flow;
    dVar3 = Network::ucf(nw,FLOW);
    std::ostream::operator<<(poVar2,dVar1 * dVar3);
  }
  return;
}

Assistant:

void Valve::validateStatus(Network* nw, double qTol)
{
    switch (valveType)
    {
    case PRV:
    case PSV:
        if (flow < -qTol)
        {
            nw->msgLog << "\nValve " << name << " flow = " << flow*nw->ucf(Units::FLOW);
        }
        break;

    default: break;
    }
}